

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O3

void TestForeign(void)

{
  _Alloc_hider data;
  BufferImpl *__tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  OutputBuffer buf;
  undefined1 local_198 [8];
  undefined1 auStack_190 [24];
  string hello;
  OutputBuffer local_158;
  string world;
  string there;
  undefined4 local_fc;
  long *local_f8 [2];
  long local_e8 [2];
  begin local_d8;
  undefined4 **local_c0;
  bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  size_type local_90;
  undefined4 *local_88;
  size_type *local_80;
  assertion_result local_78;
  const_string local_60;
  lazy_ostream local_50;
  undefined8 *local_40;
  char *local_38;
  
  local_d8.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_d8.m_file_name.m_end = "";
  local_d8.m_line_num = 0x411;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  hello._M_dataplus._M_p._0_1_ = 1;
  auStack_190._0_8_ = auStack_190._0_8_ & 0xffffffffffffff00;
  local_198 = (undefined1  [8])&PTR__lazy_ostream_001dc770;
  auStack_190._8_8_ = &boost::unit_test::lazy_ostream::inst;
  auStack_190._16_8_ = "TestForeign";
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(lazy_ostream *)local_198);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&hello);
  hello._M_dataplus._M_p = (pointer)&hello.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&hello,"hello ","");
  there._M_dataplus._M_p = (pointer)&there.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&there,"there ","");
  world._M_dataplus._M_p = (pointer)&world.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&world,"world ","");
  avro::OutputBuffer::OutputBuffer(&local_158,0);
  avro::OutputBuffer::OutputBuffer(&buf,0);
  avro::detail::BufferImpl::writeTo(buf.pimpl_.px,hello._M_dataplus._M_p,hello._M_string_length);
  data = there._M_dataplus;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f8,there._M_dataplus._M_p,
             there._M_dataplus._M_p + there._M_string_length);
  boost::bind<void,std::__cxx11::string_const&,std::__cxx11::string>
            (&local_b8,(boost *)deleteForeign,
             (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             local_f8,in_RCX);
  boost::function<void()>::
  function<boost::_bi::bind_t<void,void(*)(std::__cxx11::string_const&),boost::_bi::list1<boost::_bi::value<std::__cxx11::string>>>>
            ((function<void()> *)local_198,&local_b8,0);
  avro::detail::BufferImpl::appendForeignData
            (buf.pimpl_.px,data._M_p,there._M_string_length,(free_func *)local_198);
  boost::function0<void>::~function0((function0<void> *)local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.l_.
         super_storage1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .a1_.t_._M_dataplus._M_p !=
      &local_b8.l_.
       super_storage1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .a1_.t_.field_2) {
    operator_delete(local_b8.l_.
                    super_storage1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .a1_.t_._M_dataplus._M_p,
                    local_b8.l_.
                    super_storage1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .a1_.t_.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  avro::detail::BufferImpl::writeTo(buf.pimpl_.px,world._M_dataplus._M_p,world._M_string_length);
  avro::InputBuffer::InputBuffer((InputBuffer *)local_198,&buf);
  printBuffer((InputBuffer *)local_198);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_190);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x420;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_90 = (buf.pimpl_.px)->size_;
  local_80 = &local_90;
  local_88 = &local_fc;
  local_fc = 0x12;
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_90 == 0x12);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_60.m_end = "";
  auStack_190._16_8_ = &local_80;
  auStack_190._0_8_ = auStack_190._0_8_ & 0xffffffffffffff00;
  local_198 = (undefined1  [8])&PTR__lazy_ostream_001dc7f0;
  auStack_190._8_8_ = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_88;
  local_d8.m_file_name.m_end = (iterator)((ulong)local_d8.m_file_name.m_end & 0xffffffffffffff00);
  local_d8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc830;
  local_d8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_50,&local_60,0x420,CHECK,CHECK_EQUAL,2,"buf.size()",
             (InputBuffer *)local_198,"18U",&local_d8);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  auStack_190._0_8_ = local_158.pimpl_.pn.pi_;
  local_198 = (undefined1  [8])local_158.pimpl_.px;
  if (buf.pimpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (buf.pimpl_.pn.pi_)->use_count_ = (buf.pimpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_158.pimpl_.px = buf.pimpl_.px;
  local_158.pimpl_.pn.pi_ = buf.pimpl_.pn.pi_;
  boost::detail::shared_count::~shared_count((shared_count *)auStack_190);
  boost::detail::shared_count::~shared_count(&buf.pimpl_.pn);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Leaving inner scope\n",0x14);
  safeToDelete = true;
  boost::detail::shared_count::~shared_count(&local_158.pimpl_.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)world._M_dataplus._M_p != &world.field_2) {
    operator_delete(world._M_dataplus._M_p,world.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)there._M_dataplus._M_p != &there.field_2) {
    operator_delete(there._M_dataplus._M_p,there.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hello._M_dataplus._M_p != &hello.field_2) {
    operator_delete(hello._M_dataplus._M_p,hello.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Leaving outer scope\n",0x14);
  safeToDelete = false;
  return;
}

Assistant:

void TestForeign ()  
{
    BOOST_TEST_MESSAGE( "TestForeign");
    {
        std::string hello = "hello ";
        std::string there = "there ";
        std::string world = "world ";

        OutputBuffer copy;

        {
            OutputBuffer buf;
            buf.writeTo(hello.c_str(), hello.size());
            buf.appendForeignData(there.c_str(), there.size(), boost::bind(&deleteForeign, there));
            buf.writeTo(world.c_str(), world.size());
        
            printBuffer(buf);
            BOOST_CHECK_EQUAL(buf.size(), 18U);
            copy = buf;
        }
        std::cout << "Leaving inner scope\n";
        safeToDelete = true;
    }
    std::cout << "Leaving outer scope\n";
    safeToDelete = false;
}